

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_http.c
# Opt level: O0

size_t read_line(int socket,dino_string_ptr *string_buffer_ptr)

{
  dino_string_ptr pdVar1;
  ssize_t sVar2;
  ssize_t n;
  dino_string_ptr *ppdStack_20;
  char c;
  dino_string_ptr *string_buffer_ptr_local;
  size_t sStack_10;
  int socket_local;
  
  if (string_buffer_ptr == (dino_string_ptr *)0x0) {
    sStack_10 = 0;
  }
  else {
    ppdStack_20 = string_buffer_ptr;
    string_buffer_ptr_local._4_4_ = socket;
    if (*string_buffer_ptr == (dino_string_ptr)0x0) {
      pdVar1 = dino_string_new();
      *ppdStack_20 = pdVar1;
    }
    else {
      dino_string_reset(*string_buffer_ptr);
    }
    n._7_1_ = '\0';
    while (n._7_1_ != '\n') {
      sVar2 = recv(string_buffer_ptr_local._4_4_,(void *)((long)&n + 7),1,0);
      if (sVar2 < 1) {
        n._7_1_ = '\n';
      }
      else {
        if (n._7_1_ == '\r') {
          sVar2 = recv(string_buffer_ptr_local._4_4_,(void *)((long)&n + 7),1,2);
          if ((sVar2 < 1) || (n._7_1_ != '\n')) {
            n._7_1_ = '\n';
          }
          else {
            recv(string_buffer_ptr_local._4_4_,(void *)((long)&n + 7),1,0);
          }
        }
        dino_string_append_char(*ppdStack_20,n._7_1_);
      }
    }
    sStack_10 = dino_string_c_strlen(*ppdStack_20);
  }
  return sStack_10;
}

Assistant:

size_t read_line(int socket, dino_string_ptr *string_buffer_ptr) {

    // If input is invalid then just error out.
    //
    if (NULL == string_buffer_ptr) {
        return 0;
    }

    // We are getting a new "line" so wack the old one if it exists.
    //
    if (*string_buffer_ptr) {
        dino_string_reset(*string_buffer_ptr);
    } else {
        *string_buffer_ptr = dino_string_new();
    }

    // Now we read in the data:
    //
    char c = '\0';

    while (c != '\n') {
        ssize_t n = recv(socket, &c, 1, 0);

        if (n > 0) {
            if (c == '\r') {
                n = recv(socket, &c, 1, MSG_PEEK);

                if ((n > 0) && (c == '\n')) {
                    recv(socket, &c, 1, 0);
                } else {
                    c = '\n';
                }
            }

            dino_string_append_char(*string_buffer_ptr, c);
        } else {
            c = '\n';
        }
    }

    return dino_string_c_strlen(*string_buffer_ptr);
}